

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O1

void Nwk_ManLevel_rec(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  Nwk_Obj_t *pNVar7;
  long lVar8;
  ulong uVar9;
  
  iVar5 = pObj->pMan->nTravIds;
  if (pObj->TravId != iVar5) {
    p = pObj->pMan->pManTime;
    pObj->TravId = iVar5;
    uVar2 = *(uint *)&pObj->field_0x20 & 7;
    if (uVar2 - 2 < 2) {
      iVar5 = 0;
      if (pObj->nFanins < 1) {
        uVar2 = 0;
      }
      else {
        pNVar7 = *pObj->pFanio;
        if (pNVar7 == (Nwk_Obj_t *)0x0) {
          uVar2 = 1;
          iVar5 = 0;
        }
        else {
          iVar5 = 0;
          lVar8 = 1;
          do {
            Nwk_ManLevel_rec(pNVar7);
            iVar3 = pNVar7->Level;
            if (pNVar7->Level < iVar5) {
              iVar3 = iVar5;
            }
            iVar5 = iVar3;
            if (pObj->nFanins <= lVar8) break;
            pNVar7 = pObj->pFanio[lVar8];
            lVar8 = lVar8 + 1;
          } while (pNVar7 != (Nwk_Obj_t *)0x0);
          uVar2 = (uint)(0 < pObj->nFanins);
        }
      }
      if ((*(uint *)&pObj->field_0x20 & 7) == 3) {
        iVar5 = iVar5 + uVar2;
      }
    }
    else {
      if (uVar2 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,200,"void Nwk_ManLevel_rec(Nwk_Obj_t *)");
      }
      iVar5 = 0;
      if (p != (Tim_Man_t *)0x0) {
        iVar3 = Tim_ManBoxForCi(p,*(uint *)&pObj->field_0x20 >> 7);
        if (-1 < iVar3) {
          uVar2 = Tim_ManBoxInputFirst(p,iVar3);
          uVar4 = Tim_ManBoxInputNum(p,iVar3);
          if ((int)uVar4 < 1) {
            iVar5 = 1;
          }
          else {
            uVar9 = (ulong)uVar2;
            uVar6 = (ulong)uVar4;
            iVar5 = 0;
            do {
              if (((int)uVar2 < 0) || (pVVar1 = pObj->pMan->vCos, pVVar1->nSize <= (int)uVar9)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pNVar7 = (Nwk_Obj_t *)pVVar1->pArray[uVar9];
              Nwk_ManLevel_rec(pNVar7);
              iVar3 = pNVar7->Level;
              if (iVar5 <= iVar3) {
                iVar5 = iVar3;
              }
              uVar9 = uVar9 + 1;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
            iVar5 = iVar5 + 1;
          }
        }
      }
    }
    pObj->Level = iVar5;
  }
  return;
}

Assistant:

void Nwk_ManLevel_rec( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Nwk_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCi(pObj) )
    {
        if ( pManTime ) 
        {
            iBox = Tim_ManBoxForCi( pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Nwk_ManCo(pObj->pMan, iTerm1 + i);
                    Nwk_ManLevel_rec( pNext );
                    if ( LevelMax < Nwk_ObjLevel(pNext) )
                        LevelMax = Nwk_ObjLevel(pNext);
                }
                LevelMax++;
            }
        }
    }
    else if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCo(pObj) )
    {
        Nwk_ObjForEachFanin( pObj, pNext, i )
        {
            Nwk_ManLevel_rec( pNext );
            if ( LevelMax < Nwk_ObjLevel(pNext) )
                LevelMax = Nwk_ObjLevel(pNext);
        }
        if ( Nwk_ObjIsNode(pObj) && Nwk_ObjFaninNum(pObj) > 0 )
            LevelMax++;
    }
    else
        assert( 0 );
    Nwk_ObjSetLevel( pObj, LevelMax );
}